

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 floatx80_to_float128_aarch64(floatx80 a,float_status *status)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  float128 fVar6;
  float128 fVar7;
  
  uVar5 = a.low;
  uVar2 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar5 < 0)
  {
    uVar3 = (uint)(ushort)(a.high >> 0xf);
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        uVar2 != 0x7fff) {
      fVar6.high = (ulong)uVar2 << 0x30 | (ulong)uVar3 << 0x3f | uVar5 >> 0xf & 0xffffffffffff;
      fVar6.low = uVar5 << 0x31;
      return fVar6;
    }
    if ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) &&
       (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)) {
      status->float_exception_flags = status->float_exception_flags | 1;
    }
    if (status->default_nan_mode == '\0') {
      uVar1 = uVar5 * 2;
      uVar4 = (ulong)uVar3 << 0x3f;
      if (-1 < (long)uVar5) {
        uVar1 = 0x8000000000000000;
        uVar4 = 0x8000000000000000;
      }
      fVar7.low = uVar1 << 0x30;
      fVar7.high = uVar1 >> 0x10 | 0x7fff000000000000 | uVar4;
      return fVar7;
    }
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  return (float128)(ZEXT816(0x7fff800000000000) << 0x40);
}

Assistant:

float128 floatx80_to_float128(floatx80 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( ( aExp == 0x7FFF ) && (uint64_t) ( aSig<<1 ) ) {
        return commonNaNToFloat128(floatx80ToCommonNaN(a, status), status);
    }
    shift128Right( aSig<<1, 0, 16, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp, zSig0, zSig1 );

}